

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

void pbrt::DisplayDynamic
               (string *title,Point2i *resolution,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *channelNames,
               function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  Tuple2<pbrt::Point2,_int> resolution_00;
  int iVar1;
  undefined8 uVar2;
  _Any_data _Stack_d8;
  code *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  DisplayItem local_a0;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar1 == 0) {
    resolution_00 = resolution->super_Tuple2<pbrt::Point2,_int>;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b8,channelNames);
    std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function
              ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&_Stack_d8,
               getTileValues);
    DisplayItem::DisplayItem
              (&local_a0,title,(Point2i)resolution_00,&local_b8,
               (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&_Stack_d8);
    std::vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_>::
    emplace_back<pbrt::DisplayItem>
              ((vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_> *)&dynamicItems,
               &local_a0);
    std::
    vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
    ::~vector(&local_a0.channelBuffers);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0.channelNames);
    if (local_a0.getTileValues.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_a0.getTileValues.super__Function_base._M_manager)
                ((_Any_data *)&local_a0.getTileValues,(_Any_data *)&local_a0.getTileValues,
                 __destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.title._M_dataplus._M_p != &local_a0.title.field_2) {
      operator_delete(local_a0.title._M_dataplus._M_p,
                      local_a0.title.field_2._M_allocated_capacity + 1);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&_Stack_d8,&_Stack_d8,__destroy_functor);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    pthread_mutex_unlock((pthread_mutex_t *)mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar2);
}

Assistant:

void DisplayDynamic(
    const std::string &title, const Point2i &resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues) {
    std::lock_guard<std::mutex> lock(mutex);
    dynamicItems.push_back(DisplayItem(title, resolution, channelNames, getTileValues));
}